

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives_lib.cpp
# Opt level: O0

void skiwi::assign_primitive_addresses(primitive_map *pm,first_pass_data *d,uint64_t address_start)

{
  bool bVar1;
  runtime_error *this;
  pointer ppVar2;
  _Self local_50;
  _Self local_48;
  const_iterator it;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::primitive_entry>
  *pe;
  iterator __end1;
  iterator __begin1;
  primitive_map *__range1;
  uint64_t address_start_local;
  first_pass_data *d_local;
  primitive_map *pm_local;
  
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::primitive_entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::primitive_entry>_>_>
           ::begin(pm);
  pe = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::primitive_entry>
        *)std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::primitive_entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::primitive_entry>_>_>
          ::end(pm);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&pe);
    if (!bVar1) {
      return;
    }
    it._M_node = (_Base_ptr)
                 std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::primitive_entry>_>
                 ::operator*(&__end1);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         ::find(&d->label_to_address,&(((reference)it._M_node)->second).label_name);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         ::end(&d->label_to_address);
    bVar1 = std::operator==(&local_48,&local_50);
    if (bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
             ::operator->(&local_48);
    *(uint64_t *)(it._M_node + 2) = address_start + ppVar2->second;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::primitive_entry>_>
    ::operator++(&__end1);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Error during primitives library generation");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void assign_primitive_addresses(primitive_map& pm, const ASM::first_pass_data& d, uint64_t address_start)
  {
  for (auto& pe : pm)
    {
    auto it = d.label_to_address.find(pe.second.label_name);
    if (it == d.label_to_address.end())
      throw std::runtime_error("Error during primitives library generation");
    pe.second.address = address_start + it->second;
    }
  }